

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

int QtMWidgets::countRepeat(QString *str,int index,int maxCount)

{
  QChar c1;
  Promoted<int,_long_long> PVar1;
  bool local_35;
  qsizetype local_30;
  int local_28;
  int local_24;
  QChar local_1e;
  int max;
  int iStack_18;
  QChar ch;
  int count;
  int maxCount_local;
  int index_local;
  QString *str_local;
  
  max = 1;
  iStack_18 = maxCount;
  local_1e = QString::at(str,(long)index);
  local_28 = index + iStack_18;
  local_30 = QString::size(str);
  PVar1 = qMin<int,long_long>(&local_28,&local_30);
  local_24 = (int)PVar1;
  while( true ) {
    local_35 = false;
    if (index + max < local_24) {
      c1 = QString::at(str,(long)(index + max));
      local_35 = ::operator==(c1,local_1e);
    }
    if (local_35 == false) break;
    max = max + 1;
  }
  return max;
}

Assistant:

static inline int
countRepeat( const QString &str, int index, int maxCount )
{
	int count = 1;

	const QChar ch( str.at( index ) );
	const int max = qMin( index + maxCount, str.size() );

	while( index + count < max && str.at( index + count ) == ch )
		++count;

	return count;
}